

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.cpp
# Opt level: O2

HighsPresolveStatus __thiscall PresolveComponent::run(PresolveComponent *this)

{
  bool bVar1;
  HPresolve presolve;
  
  ::presolve::HPresolve::HPresolve(&presolve);
  bVar1 = ::presolve::HPresolve::okSetInput
                    (&presolve,&(this->data_).reduced_lp_,this->options_,
                     (this->options_->super_HighsOptionsStruct).presolve_reduction_limit,this->timer
                    );
  if (bVar1) {
    ::presolve::HPresolve::run(&presolve,&(this->data_).postSolveStack);
    std::vector<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>::operator=
              (&(this->data_).presolve_log_.rule,&presolve.analysis_.presolve_log_.rule);
  }
  else {
    presolve.presolve_status_ = kOutOfMemory;
  }
  this->presolve_status_ = presolve.presolve_status_;
  ::presolve::HPresolve::~HPresolve(&presolve);
  return presolve.presolve_status_;
}

Assistant:

HighsPresolveStatus PresolveComponent::run() {
  presolve::HPresolve presolve;
  if (!presolve.okSetInput(data_.reduced_lp_, *options_,
                           options_->presolve_reduction_limit, timer)) {
    presolve_status_ = HighsPresolveStatus::kOutOfMemory;
    return presolve_status_;
  }

  presolve.run(data_.postSolveStack);
  data_.presolve_log_ = presolve.getPresolveLog();
  presolve_status_ = presolve.getPresolveStatus();
  return presolve_status_;
}